

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dense.cpp
# Opt level: O0

MatrixXd * __thiscall Dense::backward(Dense *this,MatrixXd *grad_output)

{
  bool bVar1;
  LhsNested scalar;
  RowwiseReturnType this_00;
  Matrix<double,__1,__1,_0,__1,__1> *this_01;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  *other;
  RhsNested this_02;
  long in_RSI;
  MatrixXd *in_RDI;
  ConstTransposeReturnType CVar2;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  PVar3;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  PVar4;
  MatrixXd delta_biases;
  MatrixXd delta_weights;
  MatrixXd delta;
  MatrixXd *grad_input;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>_>
  *in_stack_fffffffffffffcd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  MatrixBase<Eigen::Transpose<const_Eigen::CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  *in_stack_fffffffffffffd00;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffd08;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffd38;
  
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x155a17);
  bVar1 = std::operator==(in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8);
  if (bVar1) {
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::unaryExpr<double(*)(double)>
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffce0,
               (_func_double_double **)in_stack_fffffffffffffcd8);
    Eigen::
    DenseBase<Eigen::CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::transpose((DenseBase<Eigen::CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)0x155aaf);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    cwiseProduct<Eigen::Transpose<Eigen::CwiseUnaryOp<double(*)(double),Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
              (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffce0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Transpose<const_Eigen::CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                *)in_stack_fffffffffffffcd8);
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8);
    if (bVar1) {
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::unaryExpr<double(*)(double)>
                ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffce0,
                 (_func_double_double **)in_stack_fffffffffffffcd8);
      CVar2 = Eigen::
              DenseBase<Eigen::CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
              ::transpose((DenseBase<Eigen::CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)0x155bc1);
      in_stack_fffffffffffffd38 =
           (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)CVar2.m_matrix.m_functor;
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      cwiseProduct<Eigen::Transpose<Eigen::CwiseUnaryOp<double(*)(double),Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffce0,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Transpose<const_Eigen::CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                  *)in_stack_fffffffffffffcd8);
    }
  }
  PVar3 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     in_stack_fffffffffffffce0,
                     (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     in_stack_fffffffffffffcd8);
  scalar = PVar3.m_lhs;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffce0,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)in_stack_fffffffffffffcd8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffcd8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffcd8);
  PVar4 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                    ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                     in_stack_fffffffffffffce0,
                     (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                     in_stack_fffffffffffffcd8);
  this_02 = PVar4.m_rhs.m_matrix;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffce0,
             (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)in_stack_fffffffffffffcd8);
  other = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
           *)(in_RSI + 8);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (in_stack_fffffffffffffd38,(double *)scalar);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_02.m_matrix,other);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffce0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
              *)in_stack_fffffffffffffcd8);
  this_00 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rowwise
                      ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       in_stack_fffffffffffffcd8);
  Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::mean
            ((VectorwiseOp<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_00.m_matrix);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x155dc6);
  Eigen::
  MatrixBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::internal::member_mean<double>,1>>
  ::operator*((MatrixBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_mean<double>,_1>_>
               *)in_stack_fffffffffffffd38,(long *)scalar);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_mean<double>,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffce0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_mean<double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)in_stack_fffffffffffffcd8);
  this_01 = (Matrix<double,__1,__1,_0,__1,__1> *)(in_RSI + 0x20);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffcd8);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
            ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_fffffffffffffd38,(double *)scalar);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_02.m_matrix,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>
              *)other);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=(this_01,in_stack_fffffffffffffcd8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x155eb1);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x155ebe);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x155f40);
  return in_RDI;
}

Assistant:

Eigen::MatrixXd Dense::backward(Eigen::MatrixXd grad_output) {
    Eigen::MatrixXd delta;
    if(type == "tanh") {
        delta = grad_output.cwiseProduct(activation.unaryExpr(&activation_functions::tanh_transfer_derivative).transpose());
    }
    else if(type == "sigmoid") {
        delta = grad_output.cwiseProduct(activation.unaryExpr(&activation_functions::sigmoid_transfer_derivative).transpose());
    }

    Eigen::MatrixXd grad_input = weigths * delta;

    Eigen::MatrixXd delta_weights = last_input.transpose() * delta.transpose();
    weigths = weigths + delta_weights * *learning_rate;

    Eigen::MatrixXd delta_biases = delta.rowwise().mean() * last_input.rows();
    biases = biases + delta_biases.transpose() * *learning_rate;

    return grad_input;
}